

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
llvm::SmallVector<$8cbd7509$>::SmallVector
          (SmallVector<_8cbd7509_> *this,SmallVector<_8cbd7509_> *RHS)

{
  bool bVar1;
  SmallVector<_8cbd7509_> *RHS_local;
  SmallVector<_8cbd7509_> *this_local;
  
  SmallVectorImpl<$7648aab9$>::SmallVectorImpl(&this->super_SmallVectorImpl<_7648aab9_>,10);
  bVar1 = SmallVectorBase::empty((SmallVectorBase *)RHS);
  if (!bVar1) {
    SmallVectorImpl<$7648aab9$>::operator=
              (&this->super_SmallVectorImpl<_7648aab9_>,&RHS->super_SmallVectorImpl<_7648aab9_>);
  }
  return;
}

Assistant:

SmallVector(const SmallVector &RHS) : SmallVectorImpl<T>(N) {
    if (!RHS.empty())
      SmallVectorImpl<T>::operator=(RHS);
  }